

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Mini_Lut_t * Gia_ManToMiniLut(Gia_Man_t *pGia)

{
  word *pwVar1;
  word wVar2;
  Vec_Wrd_t *pVVar3;
  int w;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Mini_Lut_t *p;
  int *piVar7;
  uint *puVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  Vec_Bit_t *p_00;
  word *pwVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  word *pwVar17;
  ulong uVar18;
  word *pwVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  word *pLimit;
  int iVar23;
  bool bVar24;
  int Fanin;
  Vec_Int_t *local_90;
  long local_88;
  Gia_Obj_t *local_80;
  int pVars [16];
  
  pVVar6 = Vec_IntAlloc(0x10);
  iVar23 = pGia->nObjs;
  local_90 = Vec_IntAlloc(iVar23);
  local_90->nSize = iVar23;
  if (local_90->pArray != (int *)0x0) {
    memset(local_90->pArray,0,(long)iVar23 << 2);
  }
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x137,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
  }
  iVar4 = Gia_ManLutSizeMax(pGia);
  iVar23 = 2;
  if (2 < iVar4) {
    iVar23 = iVar4;
  }
  uVar21 = 1 << ((char)iVar23 - 6U & 0x1f);
  if (iVar4 < 7) {
    uVar21 = 1;
  }
  if (0x10 < iVar4) {
    __assert_fail("LutSize >= 2 && LutSize <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                  ,0x96,"Mini_Lut_t *Mini_LutStart(int)");
  }
  p = (Mini_Lut_t *)calloc(1,0x20);
  p->LutSize = iVar23;
  p->nCap = 0xff;
  piVar7 = (int *)malloc((ulong)(uint)(iVar23 * 0xff) << 2);
  p->pArray = piVar7;
  uVar15 = 0xff << ((char)iVar23 - 5U & 0x1f);
  if (iVar4 < 6) {
    uVar15 = 0xff;
  }
  puVar8 = (uint *)malloc((ulong)uVar15 << 2);
  p->pTruths = puVar8;
  uVar18 = 0;
  Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
  Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
  uVar15 = 1 << ((char)p->LutSize - 5U & 0x1f);
  if (p->LutSize < 6) {
    uVar15 = 1;
  }
  uVar9 = 0;
  if (0 < (int)uVar15) {
    uVar9 = (ulong)uVar15;
  }
  for (; uVar9 != uVar18; uVar18 = uVar18 + 1) {
    p->pTruths[uVar18] = 0;
  }
  lVar14 = (long)(int)uVar15;
  while (bVar24 = uVar9 != 0, uVar9 = uVar9 - 1, bVar24) {
    p->pTruths[lVar14] = 0xffffffff;
    lVar14 = lVar14 + 1;
  }
  Gia_ManFillValue(pGia);
  pGia->pObjs->Value = 0;
  iVar4 = 0;
  while ((iVar4 < pGia->vCis->nSize &&
         (pGVar10 = Gia_ManCi(pGia,iVar4), pGVar10 != (Gia_Obj_t *)0x0))) {
    Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
    pGVar10->Value = p->nSize - 1;
    iVar4 = iVar4 + 1;
  }
  p_00 = Gia_ManFindComplLuts(pGia);
  Gia_ObjComputeTruthTableStart(pGia,iVar23);
  uVar18 = 0;
  if (0 < (int)uVar21) {
    uVar18 = (ulong)uVar21;
  }
  local_88 = (long)(int)uVar21;
  iVar23 = 1;
  do {
    if (pGia->nObjs <= iVar23) {
      Vec_IntFree(pVVar6);
      pGia->vTtMemory->nSize = 0;
      do {
        pVVar6 = local_90;
        pVVar3 = pGia->vTtMemory;
        iVar23 = (int)uVar18;
        uVar18 = (ulong)(iVar23 - 1);
        if (iVar23 == 0) {
          pwVar11 = pVVar3->pArray;
          iVar23 = 0;
          while ((iVar23 < pGia->vCos->nSize &&
                 (pGVar10 = Gia_ManCo(pGia,iVar23), pGVar10 != (Gia_Obj_t *)0x0))) {
            uVar21 = (uint)*(undefined8 *)pGVar10 >> 0x1d & 1;
            if (pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff) != pGia->pObjs) {
              iVar4 = Gia_ObjFaninId0p(pGia,pGVar10);
              uVar15 = Vec_BitEntry(p_00,iVar4);
              if (uVar21 == uVar15) {
                uVar21 = pGVar10[-(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)].Value;
              }
              else {
                uVar15 = pGVar10[-(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)].Value;
                Fanin = uVar15;
                uVar21 = Vec_IntEntry(pVVar6,uVar15);
                if (uVar21 == 0) {
                  uVar21 = Mini_LutCreateNode(p,1,&Fanin,(uint *)pwVar11);
                  Vec_IntWriteEntry(pVVar6,uVar15,uVar21);
                }
              }
            }
            uVar21 = Mini_LutCreatePo(p,uVar21);
            pGVar10->Value = uVar21;
            iVar23 = iVar23 + 1;
          }
          Vec_IntFree(pVVar6);
          free(p_00->pArray);
          free(p_00);
          Gia_ObjComputeTruthTableStop(pGia);
          p->nRegs = pGia->nRegs;
          return p;
        }
        iVar23 = pVVar3->nSize;
        if (iVar23 == pVVar3->nCap) {
          uVar21 = iVar23 * 2;
          if (iVar23 < 0x10) {
            uVar21 = 0x10;
          }
          if (iVar23 < (int)uVar21) {
            if (pVVar3->pArray == (word *)0x0) {
              pwVar11 = (word *)malloc((ulong)uVar21 << 3);
            }
            else {
              pwVar11 = (word *)realloc(pVVar3->pArray,(ulong)uVar21 << 3);
            }
            pVVar3->pArray = pwVar11;
            if (pwVar11 == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar3->nCap = uVar21;
            iVar23 = pVVar3->nSize;
          }
        }
        pVVar3->nSize = iVar23 + 1;
        pVVar3->pArray[iVar23] = 0x5555555555555555;
      } while( true );
    }
    iVar4 = Gia_ObjIsLut(pGia,iVar23);
    if (iVar4 != 0) {
      pVVar6->nSize = 0;
      for (lVar14 = 0; iVar4 = Gia_ObjLutSize(pGia,iVar23), lVar14 < iVar4; lVar14 = lVar14 + 1) {
        piVar7 = Gia_ObjLutFanins(pGia,iVar23);
        Vec_IntPush(pVVar6,piVar7[lVar14]);
      }
      if (6 < pVVar6->nSize) {
        uVar22 = pVVar6->nSize - 7;
        for (uVar15 = uVar22; -1 < (int)uVar15; uVar15 = uVar15 - 1) {
          iVar4 = Vec_IntEntry(pVVar6,uVar15);
          Vec_IntPush(pVVar6,iVar4);
        }
        for (; iVar4 = pVVar6->nSize, -1 < (int)uVar22; uVar22 = uVar22 - 1) {
          if (iVar4 <= (int)uVar22) {
            __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
          }
          iVar4 = iVar4 + -1;
          pVVar6->nSize = iVar4;
          for (uVar9 = (ulong)uVar22; (long)uVar9 < (long)iVar4; uVar9 = uVar9 + 1) {
            pVVar6->pArray[uVar9] = pVVar6->pArray[uVar9 + 1];
            iVar4 = pVVar6->nSize;
          }
        }
        iVar5 = Gia_ObjLutSize(pGia,iVar23);
        if (iVar4 != iVar5) {
          __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                        ,0x152,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
        }
      }
      for (lVar14 = 0; lVar14 < pVVar6->nSize; lVar14 = lVar14 + 1) {
        iVar4 = Vec_IntEntry(pVVar6,(int)lVar14);
        pGVar10 = Gia_ManObj(pGia,iVar4);
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        pVars[lVar14] = pGVar10->Value;
      }
      local_80 = Gia_ManObj(pGia,iVar23);
      pwVar11 = Gia_ObjComputeTruthTableCut(pGia,local_80,pVVar6);
      iVar4 = Vec_BitEntry(p_00,iVar23);
      if (iVar4 != 0) {
        for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
          pwVar11[uVar9] = ~pwVar11[uVar9];
        }
      }
      pwVar1 = pwVar11 + local_88;
      for (uVar9 = 0; (long)uVar9 < (long)pVVar6->nSize; uVar9 = uVar9 + 1) {
        iVar4 = Vec_IntEntry(pVVar6,(int)uVar9);
        iVar4 = Vec_BitEntry(p_00,iVar4);
        if (iVar4 != 0) {
          bVar12 = (byte)uVar9;
          if (uVar21 == 1) {
            bVar12 = (byte)(1 << (bVar12 & 0x1f));
            *pwVar11 = (s_Truths6[uVar9] & *pwVar11) >> (bVar12 & 0x3f) |
                       *pwVar11 << (bVar12 & 0x3f) & s_Truths6[uVar9];
          }
          else if (uVar9 < 6) {
            for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              bVar13 = (byte)(1 << (bVar12 & 0x1f));
              pwVar11[uVar16] =
                   (s_Truths6[uVar9] & pwVar11[uVar16]) >> (bVar13 & 0x3f) |
                   pwVar11[uVar16] << (bVar13 & 0x3f) & s_Truths6[uVar9];
            }
          }
          else {
            uVar15 = 1 << (bVar12 - 6 & 0x1f);
            iVar4 = 2 << (bVar12 - 6 & 0x1f);
            uVar16 = 0;
            if (0 < (int)uVar15) {
              uVar16 = (ulong)uVar15;
            }
            pwVar17 = pwVar11 + (int)uVar15;
            for (pwVar19 = pwVar11; pwVar19 < pwVar1; pwVar19 = pwVar19 + iVar4) {
              for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
                wVar2 = pwVar19[uVar20];
                pwVar19[uVar20] = pwVar17[uVar20];
                pwVar17[uVar20] = wVar2;
              }
              pwVar17 = pwVar17 + iVar4;
            }
          }
        }
      }
      iVar4 = Gia_ObjLutSize(pGia,iVar23);
      uVar15 = Mini_LutCreateNode(p,iVar4,pVars,(uint *)pwVar11);
      local_80->Value = uVar15;
    }
    iVar23 = iVar23 + 1;
  } while( true );
}

Assistant:

Mini_Lut_t * Gia_ManToMiniLut( Gia_Man_t * pGia )
{
    Mini_Lut_t * p;
    Vec_Bit_t * vMarks;
    Gia_Obj_t * pObj, * pFanin;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vInvMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, iFanin, LutSize, nWords, Count = 0, pVars[16];
    word * pTruth;
    assert( Gia_ManHasMapping(pGia) );
    LutSize = Gia_ManLutSizeMax( pGia );
    LutSize = Abc_MaxInt( LutSize, 2 );
    nWords  = Abc_Truth6WordNum( LutSize );
    assert( LutSize >= 2 );
    // create the manager
    p = Mini_LutStart( LutSize );
    // create primary inputs
    Gia_ManFillValue( pGia );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachCi( pGia, pObj, i )
        pObj->Value = Mini_LutCreatePi(p);
    // create internal nodes
    vMarks = Gia_ManFindComplLuts( pGia );
    Gia_ObjComputeTruthTableStart( pGia, LutSize );
    Gia_ManForEachLut( pGia, i )
    {
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( pGia, i, iFanin, k )
            Vec_IntPush( vLeaves, iFanin );
        if ( Vec_IntSize(vLeaves) > 6 )
        {
            int Extra = Vec_IntSize(vLeaves) - 7;
            for ( k = Extra; k >= 0; k-- )
                Vec_IntPush( vLeaves, Vec_IntEntry(vLeaves, k) );
            for ( k = Extra; k >= 0; k-- )
                Vec_IntDrop( vLeaves, k );
            assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i) );
        }
        Gia_ManForEachObjVec( vLeaves, pGia, pFanin, k )
            pVars[k] = pFanin->Value;
        pObj = Gia_ManObj( pGia, i );
        pTruth = Gia_ObjComputeTruthTableCut( pGia, pObj, vLeaves );
        if ( Vec_BitEntry(vMarks, i) )
            Abc_TtNot( pTruth, nWords );
        Vec_IntForEachEntry( vLeaves, iFanin, k )
            if ( Vec_BitEntry(vMarks, iFanin) )
                Abc_TtFlip( pTruth, nWords, k );
        pObj->Value = Mini_LutCreateNode( p, Gia_ObjLutSize(pGia, i), pVars, (unsigned *)pTruth );
    }
    Vec_IntFree( vLeaves );
    // create inverter truth table
    Vec_WrdClear( pGia->vTtMemory );
    for ( i = 0; i < nWords; i++ )
        Vec_WrdPush( pGia->vTtMemory, ABC_CONST(0x5555555555555555) );
    pTruth = Vec_WrdArray( pGia->vTtMemory );
    // create primary outputs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(pGia) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFaninC0(pObj) );
        else if ( Gia_ObjFaninC0(pObj) == Vec_BitEntry(vMarks, Gia_ObjFaninId0p(pGia, pObj)) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFanin0(pObj)->Value );
        else // add inverter LUT
        {
            int LutInv, Fanin = Gia_ObjFanin0(pObj)->Value;
            if ( (LutInv = Vec_IntEntry(vInvMap, Fanin)) == 0 )
            {
                LutInv = Mini_LutCreateNode( p, 1, &Fanin, (unsigned *)pTruth );
                Vec_IntWriteEntry( vInvMap, Fanin, LutInv );
                Count++;
            }
            pObj->Value = Mini_LutCreatePo( p, LutInv );
        }
    }
    Vec_IntFree( vInvMap );
    Vec_BitFree( vMarks );
    Gia_ObjComputeTruthTableStop( pGia );
    // set registers
    Mini_LutSetRegNum( p, Gia_ManRegNum(pGia) );
    //Mini_LutPrintStats( p );
    //printf( "Added %d inverters.\n", Count );
    return p;
}